

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_handle_map_flow(Parser *this)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr chars;
  csubstr s;
  ro_substr chars_00;
  csubstr val;
  csubstr fmt;
  csubstr fmt_00;
  csubstr fmt_01;
  csubstr fmt_02;
  bool bVar10;
  error_flags eVar11;
  int iVar12;
  Parser *in_RDI;
  bool is_quoted_1;
  char msg_11 [30];
  char msg_10 [31];
  char msg_9 [31];
  size_t pos_1;
  char msg_8 [30];
  size_t num;
  char msg_7 [39];
  csubstr trimmed;
  bool is_quoted;
  char msg_6 [31];
  char msg_5 [31];
  char msg_4 [35];
  char msg_3 [31];
  char msg_2 [31];
  char msg [35];
  csubstr rem;
  size_t pos;
  char msg_1 [58];
  flag_t in_stack_fffffffffffff938;
  flag_t in_stack_fffffffffffff93c;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  flag_t in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  Parser *in_stack_fffffffffffff958;
  undefined7 in_stack_fffffffffffff960;
  undefined7 uVar13;
  char in_stack_fffffffffffff967;
  undefined1 uVar14;
  basic_substring<const_char> *in_stack_fffffffffffff968;
  pfn_error p_Var15;
  size_t in_stack_fffffffffffff970;
  char *pcVar16;
  basic_substring<const_char> *in_stack_fffffffffffff978;
  undefined8 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  undefined4 uVar17;
  flag_t in_stack_fffffffffffff98c;
  undefined4 uVar18;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  basic_substring<const_char> *in_stack_fffffffffffff998;
  char *in_stack_fffffffffffff9a0;
  size_t in_stack_fffffffffffff9a8;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  basic_substring<const_char> *in_stack_fffffffffffff9b8;
  Parser *in_stack_fffffffffffff9c8;
  Parser *in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9e8;
  undefined1 explicit_flow_chars;
  Parser *in_stack_fffffffffffff9f0;
  char *in_stack_fffffffffffff9f8;
  Parser *in_stack_fffffffffffffa00;
  Parser *in_stack_fffffffffffffa08;
  pfn_error in_stack_fffffffffffffa18;
  Parser *in_stack_fffffffffffffa20;
  Parser *in_stack_fffffffffffffa48;
  basic_substring<char_const> local_5a8 [16];
  char *local_598;
  char *local_590;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined4 in_stack_fffffffffffffaa0;
  flag_t in_stack_fffffffffffffaa4;
  Parser *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  size_t in_stack_fffffffffffffab8;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  Parser *local_510;
  char local_508 [40];
  flag_t local_4e0;
  flag_t fStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  flag_t local_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  Parser *local_4c0;
  char local_4b8 [32];
  basic_substring<char_const> local_498 [32];
  size_t local_478;
  size_t local_470;
  basic_substring<char_const> local_468 [16];
  char *local_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  size_t local_430;
  char local_428 [32];
  basic_substring<char_const> local_408 [16];
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  flag_t local_3e0;
  flag_t fStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  flag_t local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  Parser *local_3c0;
  undefined1 local_3b8 [48];
  ro_substr local_388;
  basic_substring<char_const> local_378 [15];
  undefined1 in_stack_fffffffffffffc97;
  Parser *in_stack_fffffffffffffc98;
  basic_substring<const_char> local_358;
  char *local_348;
  char *local_340;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined7 local_310;
  undefined1 in_stack_fffffffffffffcf7;
  Parser *in_stack_fffffffffffffcf8;
  size_t local_2e0;
  Tree *pTStack_2d8;
  undefined8 local_2d0;
  size_t sStack_2c8;
  Parser *local_2c0;
  char *local_2b8;
  undefined1 local_2b0;
  undefined1 uStack_2af;
  undefined1 uStack_2ae;
  undefined1 uStack_2ad;
  undefined1 uStack_2ac;
  undefined1 uStack_2ab;
  undefined1 uStack_2aa;
  undefined1 uStack_2a9;
  undefined1 local_2a8;
  undefined1 uStack_2a7;
  undefined1 uStack_2a6;
  undefined1 uStack_2a5;
  undefined1 uStack_2a4;
  undefined1 uStack_2a3;
  undefined1 uStack_2a2;
  undefined1 uStack_2a1;
  undefined4 local_2a0;
  undefined2 local_29c;
  undefined1 local_29a;
  basic_substring<char_const> local_280 [16];
  size_t local_270;
  char *pcStack_268;
  size_t local_260;
  char *pcStack_258;
  Parser *local_250;
  char local_248 [40];
  char *local_220;
  size_t sStack_218;
  size_t local_210;
  size_t sStack_208;
  Parser *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe30;
  size_t sStack_1c8;
  char *local_1c0;
  size_t sStack_1b8;
  Parser *local_1b0;
  char local_1a8 [8];
  undefined1 local_1a0 [144];
  char *local_110;
  char *local_f8;
  undefined4 local_f0;
  char *local_e8;
  undefined1 *local_e0;
  size_t local_d8;
  size_t local_d0;
  char *local_c8;
  undefined4 local_c0;
  char *local_b8;
  basic_substring<const_char> *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 local_91;
  char *local_90;
  size_t local_88;
  Parser *local_60;
  undefined1 local_58 [8];
  bool *in_stack_ffffffffffffffb0;
  csubstr *in_stack_ffffffffffffffb8;
  Parser *in_stack_ffffffffffffffc0;
  Parser *in_stack_ffffffffffffffd8;
  
  explicit_flow_chars = (undefined1)((ulong)in_stack_fffffffffffff9e8 >> 0x38);
  local_1a0._136_8_ = (in_RDI->m_state->line_contents).rem.str;
  local_110 = (char *)(in_RDI->m_state->line_contents).rem.len;
  bVar10 = has_all(in_RDI,0x14);
  if (!bVar10) {
    memcpy(local_1a0 + 0x58,"check failed: (has_all(RMAP|FLOW))",0x23);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                       (char *)in_stack_fffffffffffff958,
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
    in_stack_fffffffffffff948 = (flag_t)local_1a0._64_8_;
    in_stack_fffffffffffff94c = SUB84(local_1a0._64_8_,4);
    in_stack_fffffffffffff950 = (undefined4)local_1a0._72_8_;
    in_stack_fffffffffffff954 = SUB84(local_1a0._72_8_,4);
    in_stack_fffffffffffff938 = (flag_t)local_1a0._48_8_;
    in_stack_fffffffffffff93c = SUB84(local_1a0._48_8_,4);
    in_stack_fffffffffffff940 = (undefined4)local_1a0._56_8_;
    in_stack_fffffffffffff944 = SUB84(local_1a0._56_8_,4);
    LVar1.super_LineCol.line._0_4_ = in_stack_fffffffffffff940;
    LVar1.super_LineCol.offset = local_1a0._48_8_;
    LVar1.super_LineCol.line._4_4_ = in_stack_fffffffffffff944;
    LVar1.super_LineCol.col._0_4_ = in_stack_fffffffffffff948;
    LVar1.super_LineCol.col._4_4_ = in_stack_fffffffffffff94c;
    LVar1.name.str._0_4_ = in_stack_fffffffffffff950;
    LVar1.name.str._4_4_ = in_stack_fffffffffffff954;
    LVar1.name.len = local_1a0._80_8_;
    (*p_Var15)(local_1a0 + 0x58,0x23,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff958 = (Parser *)local_1a0._80_8_;
  }
  bVar10 = basic_substring<const_char>::begins_with
                     ((basic_substring<const_char> *)(local_1a0 + 0x88),' ');
  if (bVar10) {
    bVar10 = basic_substring<const_char>::begins_with(&(in_RDI->m_state->line_contents).rem,' ');
    if (!bVar10) {
      memcpy(local_58,"check failed: (m_state->line_contents.rem.begins_with(c))",0x3a);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      in_stack_fffffffffffffa20 = (Parser *)(in_RDI->m_stack).m_callbacks.m_error;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                         (char *)in_stack_fffffffffffff958,
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      (*(code *)in_stack_fffffffffffffa20)(local_58,0x3a,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff958 = local_60;
    }
    local_88 = basic_substring<const_char>::first_not_of
                         (in_stack_fffffffffffff968,in_stack_fffffffffffff967,
                          (size_t)in_stack_fffffffffffff958);
    if (local_88 == 0xffffffffffffffff) {
      local_88 = (in_RDI->m_state->line_contents).rem.len;
    }
    _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
    return true;
  }
  bVar10 = basic_substring<const_char>::begins_with
                     ((basic_substring<const_char> *)(local_1a0 + 0x88),'#');
  if (bVar10) {
    _scan_comment(in_stack_fffffffffffffa08);
    return true;
  }
  bVar10 = basic_substring<const_char>::begins_with
                     ((basic_substring<const_char> *)(local_1a0 + 0x88),'}');
  if (bVar10) {
    bVar10 = has_all(in_RDI,0x200);
    if (bVar10) {
      _append_key_val_null(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      rem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                in_stack_fffffffffffff93c);
    }
    _pop_level(in_stack_fffffffffffff9c8);
    _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
    bVar10 = has_all(in_RDI,0x2000);
    if (bVar10) {
      _stop_seqimap(in_stack_fffffffffffff9d0);
      _pop_level(in_stack_fffffffffffff9c8);
    }
    return true;
  }
  bVar10 = has_any(in_RDI,0x100);
  if (bVar10) {
    bVar10 = has_none(in_RDI,0x40);
    if (!bVar10) {
      builtin_strncpy(local_1a8,"check fa",8);
      local_1a0[0] = 'i';
      local_1a0[1] = 'l';
      local_1a0[2] = 'e';
      local_1a0[3] = 'd';
      local_1a0[4] = ':';
      local_1a0[5] = ' ';
      local_1a0[6] = '(';
      local_1a0[7] = 'h';
      local_1a0[8] = 'a';
      local_1a0[9] = 's';
      local_1a0[10] = '_';
      local_1a0[0xb] = 'n';
      local_1a0[0xc] = 'o';
      local_1a0[0xd] = 'n';
      local_1a0[0xe] = 'e';
      local_1a0[0xf] = '(';
      local_1a0._16_4_ = 0x59454b52;
      local_1a0._20_2_ = 0x2929;
      local_1a0[0x16] = 0;
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      in_stack_fffffffffffffa18 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                         (char *)in_stack_fffffffffffff958,
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      in_stack_fffffffffffff948 = (flag_t)local_1c0;
      in_stack_fffffffffffff94c = (undefined4)((ulong)local_1c0 >> 0x20);
      in_stack_fffffffffffff950 = (undefined4)sStack_1b8;
      in_stack_fffffffffffff954 = (undefined4)(sStack_1b8 >> 0x20);
      in_stack_fffffffffffff938 = (flag_t)in_stack_fffffffffffffe30;
      in_stack_fffffffffffff93c = (flag_t)((ulong)in_stack_fffffffffffffe30 >> 0x20);
      in_stack_fffffffffffff940 = (undefined4)sStack_1c8;
      in_stack_fffffffffffff944 = (undefined4)(sStack_1c8 >> 0x20);
      LVar2.super_LineCol.line._0_4_ = in_stack_fffffffffffff940;
      LVar2.super_LineCol.offset = (size_t)in_stack_fffffffffffffe30;
      LVar2.super_LineCol.line._4_4_ = in_stack_fffffffffffff944;
      LVar2.super_LineCol.col._0_4_ = in_stack_fffffffffffff948;
      LVar2.super_LineCol.col._4_4_ = in_stack_fffffffffffff94c;
      LVar2.name.str._0_4_ = in_stack_fffffffffffff950;
      LVar2.name.str._4_4_ = in_stack_fffffffffffff954;
      LVar2.name.len = (size_t)local_1b0;
      (*in_stack_fffffffffffffa18)(local_1a8,0x1f,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff958 = local_1b0;
    }
    bVar10 = has_none(in_RDI,0x80);
    if (!bVar10) {
      in_stack_fffffffffffffe08 = (char *)0x6166206b63656863;
      in_stack_fffffffffffffe10 = (char *)0x6828203a64656c69;
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
      pcVar16 = &stack0xfffffffffffffe08;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                         (char *)in_stack_fffffffffffff958,
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      in_stack_fffffffffffff958 = in_stack_fffffffffffffe00;
      in_stack_fffffffffffff948 = (flag_t)local_210;
      in_stack_fffffffffffff94c = (undefined4)(local_210 >> 0x20);
      in_stack_fffffffffffff950 = (undefined4)sStack_208;
      in_stack_fffffffffffff954 = (undefined4)(sStack_208 >> 0x20);
      in_stack_fffffffffffff938 = (flag_t)local_220;
      in_stack_fffffffffffff93c = (flag_t)((ulong)local_220 >> 0x20);
      in_stack_fffffffffffff940 = (undefined4)sStack_218;
      in_stack_fffffffffffff944 = (undefined4)(sStack_218 >> 0x20);
      LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffff940;
      LVar3.super_LineCol.offset = (size_t)local_220;
      LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffff944;
      LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffff948;
      LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffff94c;
      LVar3.name.str._0_4_ = in_stack_fffffffffffff950;
      LVar3.name.str._4_4_ = in_stack_fffffffffffff954;
      LVar3.name.len = (size_t)in_stack_fffffffffffff958;
      in_stack_fffffffffffffe00 = in_stack_fffffffffffff958;
      (*p_Var15)(pcVar16,0x1f,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
    }
    bVar10 = has_none(in_RDI,0x2000);
    if (!bVar10) {
      memcpy(local_248,"check failed: (has_none(RSEQIMAP))",0x23);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
      pcVar16 = local_248;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                         (char *)in_stack_fffffffffffff958,
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      in_stack_fffffffffffff938 = (flag_t)local_270;
      in_stack_fffffffffffff93c = (flag_t)(local_270 >> 0x20);
      in_stack_fffffffffffff940 = SUB84(pcStack_268,0);
      in_stack_fffffffffffff944 = (undefined4)((ulong)pcStack_268 >> 0x20);
      LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffff940;
      LVar4.super_LineCol.offset = local_270;
      LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffff944;
      LVar4.super_LineCol.col._0_4_ = (int)local_260;
      LVar4.super_LineCol.col._4_4_ = (int)(local_260 >> 0x20);
      LVar4.name.str._0_4_ = (int)pcStack_258;
      LVar4.name.str._4_4_ = (int)((ulong)pcStack_258 >> 0x20);
      LVar4.name.len = (size_t)local_250;
      (*p_Var15)(pcVar16,0x23,LVar4,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff958 = local_250;
    }
    basic_substring<char_const>::basic_substring<3ul>(local_280,(char (*) [3])0x3e93e9);
    pattern.str._7_1_ = in_stack_fffffffffffff967;
    pattern.str._0_7_ = in_stack_fffffffffffff960;
    pattern.len = (size_t)in_stack_fffffffffffff968;
    bVar10 = basic_substring<const_char>::begins_with
                       ((basic_substring<const_char> *)in_stack_fffffffffffff958,pattern);
    if (!bVar10) {
      bVar10 = basic_substring<const_char>::begins_with
                         ((basic_substring<const_char> *)(local_1a0 + 0x88),',');
      if (!bVar10) {
        bVar10 = is_debugger_attached();
        if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        basic_substring<char_const>::basic_substring<19ul>
                  ((basic_substring<char_const> *)&stack0xfffffffffffffd70,
                   (char (*) [19])"ERROR: parse error");
        fmt.len = (size_t)in_stack_fffffffffffffe10;
        fmt.str = in_stack_fffffffffffffe08;
        _err<>(in_stack_fffffffffffffe00,fmt);
        return false;
      }
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                   in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
      _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
      return true;
    }
    addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
    _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
    return true;
  }
  bVar10 = has_any(in_RDI,0x40);
  if (!bVar10) {
    bVar10 = has_any(in_RDI,0x80);
    if (!bVar10) {
      bVar10 = is_debugger_attached();
      if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<22ul>
                ((basic_substring<char_const> *)&stack0xfffffffffffffa48,
                 (char (*) [22])"ERROR: internal error");
      fmt_02.len = (size_t)in_stack_fffffffffffffe10;
      fmt_02.str = in_stack_fffffffffffffe08;
      _err<>(in_stack_fffffffffffffe00,fmt_02);
      return false;
    }
    bVar10 = has_none(in_RDI,0x100);
    if (!bVar10) {
      builtin_strncpy(local_4b8,"check failed: (has_none(RNXT))",0x1f);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
      uVar17 = SUB84(p_Var15,0);
      uVar18 = (undefined4)((ulong)p_Var15 >> 0x20);
      pcVar16 = local_4b8;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                         (char *)in_stack_fffffffffffff958,
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      (*(code *)CONCAT44(uVar18,uVar17))(pcVar16,0x1f,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff938 = local_4e0;
      in_stack_fffffffffffff93c = fStack_4dc;
      in_stack_fffffffffffff940 = uStack_4d8;
      in_stack_fffffffffffff944 = uStack_4d4;
      in_stack_fffffffffffff948 = local_4d0;
      in_stack_fffffffffffff94c = uStack_4cc;
      in_stack_fffffffffffff950 = uStack_4c8;
      in_stack_fffffffffffff954 = uStack_4c4;
      in_stack_fffffffffffff958 = local_4c0;
    }
    bVar10 = has_none(in_RDI,0x40);
    if (!bVar10) {
      builtin_strncpy(local_508,"check failed: (has_none(RKEY))",0x1f);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
      pcVar16 = local_508;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                         (char *)in_stack_fffffffffffff958,
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      in_stack_fffffffffffff948 = (flag_t)local_520;
      in_stack_fffffffffffff94c = (undefined4)((ulong)local_520 >> 0x20);
      in_stack_fffffffffffff950 = (undefined4)uStack_518;
      in_stack_fffffffffffff954 = (undefined4)((ulong)uStack_518 >> 0x20);
      in_stack_fffffffffffff938 = (flag_t)local_530;
      in_stack_fffffffffffff93c = (flag_t)((ulong)local_530 >> 0x20);
      in_stack_fffffffffffff940 = (undefined4)uStack_528;
      in_stack_fffffffffffff944 = (undefined4)((ulong)uStack_528 >> 0x20);
      LVar8.super_LineCol.line._0_4_ = in_stack_fffffffffffff940;
      LVar8.super_LineCol.offset = local_530;
      LVar8.super_LineCol.line._4_4_ = in_stack_fffffffffffff944;
      LVar8.super_LineCol.col._0_4_ = in_stack_fffffffffffff948;
      LVar8.super_LineCol.col._4_4_ = in_stack_fffffffffffff94c;
      LVar8.name.str._0_4_ = in_stack_fffffffffffff950;
      LVar8.name.str._4_4_ = in_stack_fffffffffffff954;
      LVar8.name.len = (size_t)local_510;
      (*p_Var15)(pcVar16,0x1f,LVar8,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff958 = local_510;
    }
    bVar10 = has_all(in_RDI,0x200);
    if (!bVar10) {
      in_stack_fffffffffffffaa8 = (Parser *)0x6166206b63656863;
      in_stack_fffffffffffffab0 = (char *)0x6828203a64656c69;
      in_stack_fffffffffffffab8._0_1_ = 'a';
      in_stack_fffffffffffffab8._1_1_ = 's';
      in_stack_fffffffffffffab8._2_1_ = '_';
      in_stack_fffffffffffffab8._3_1_ = 'a';
      in_stack_fffffffffffffab8._4_1_ = 'l';
      in_stack_fffffffffffffab8._5_1_ = 'l';
      in_stack_fffffffffffffab8._6_1_ = '(';
      in_stack_fffffffffffffab8._7_1_ = 'S';
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
      uVar13 = SUB87((Location *)&stack0xfffffffffffffaa8,0);
      uVar14 = (undefined1)((ulong)&stack0xfffffffffffffaa8 >> 0x38);
      Location::Location((Location *)&stack0xfffffffffffffaa8,(char *)in_stack_fffffffffffff958,
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      LVar9.name.len._4_4_ = in_stack_fffffffffffffaa4;
      LVar9.name.len._0_4_ = in_stack_fffffffffffffaa0;
      in_stack_fffffffffffff938 = (flag_t)local_580;
      in_stack_fffffffffffff93c = (flag_t)((ulong)local_580 >> 0x20);
      in_stack_fffffffffffff940 = (undefined4)uStack_578;
      in_stack_fffffffffffff944 = (undefined4)((ulong)uStack_578 >> 0x20);
      LVar9.super_LineCol.line._0_4_ = in_stack_fffffffffffff940;
      LVar9.super_LineCol.offset = local_580;
      LVar9.super_LineCol.line._4_4_ = in_stack_fffffffffffff944;
      LVar9.super_LineCol.col._0_4_ = (int)local_570;
      LVar9.super_LineCol.col._4_4_ = (int)((ulong)local_570 >> 0x20);
      LVar9.name.str._0_4_ = (int)uStack_568;
      LVar9.name.str._4_4_ = (int)((ulong)uStack_568 >> 0x20);
      (*p_Var15)((char *)CONCAT17(uVar14,uVar13),0x1e,LVar9,
                 (in_RDI->m_stack).m_callbacks.m_user_data);
    }
    bVar10 = _scan_scalar_map_flow
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb0);
    if (bVar10) {
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                   in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
      local_598 = (char *)local_1a0._136_8_;
      local_590 = local_110;
      val.len = in_stack_fffffffffffffab8;
      val.str = in_stack_fffffffffffffab0;
      _append_key_val(in_stack_fffffffffffffaa8,val,in_stack_fffffffffffffaa4);
      bVar10 = has_all(in_RDI,0x2000);
      if (bVar10) {
        _stop_seqimap(in_stack_fffffffffffff9d0);
        _pop_level(in_stack_fffffffffffff9c8);
      }
      return true;
    }
    bVar10 = basic_substring<const_char>::begins_with
                       ((basic_substring<const_char> *)(local_1a0 + 0x88),'[');
    if (bVar10) {
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                   in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
      _push_level(in_stack_fffffffffffff9f0,(bool)explicit_flow_chars);
      _move_scalar_from_top(in_stack_fffffffffffffa48);
      _start_seq(in_stack_fffffffffffffcf8,(bool)in_stack_fffffffffffffcf7);
      add_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                in_stack_fffffffffffff93c);
      _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
      return true;
    }
    bVar10 = basic_substring<const_char>::begins_with
                       ((basic_substring<const_char> *)(local_1a0 + 0x88),'{');
    if (bVar10) {
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                   in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
      _push_level(in_stack_fffffffffffff9f0,(bool)explicit_flow_chars);
      _move_scalar_from_top(in_stack_fffffffffffffa48);
      _start_map(in_stack_fffffffffffffc98,(bool)in_stack_fffffffffffffc97);
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                   in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
      _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
      return true;
    }
    bVar10 = _handle_types(in_stack_ffffffffffffffd8);
    if (bVar10) {
      return true;
    }
    bVar10 = _handle_val_anchors_and_refs
                       ((Parser *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
    if (bVar10) {
      return true;
    }
    bVar10 = basic_substring<const_char>::begins_with
                       ((basic_substring<const_char> *)(local_1a0 + 0x88),',');
    if (bVar10) {
      _append_key_val_null(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                   in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
      _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
      bVar10 = has_any(in_RDI,0x2000);
      if (bVar10) {
        _stop_seqimap(in_stack_fffffffffffff9d0);
        _pop_level(in_stack_fffffffffffff9c8);
      }
      return true;
    }
    bVar10 = has_any(in_RDI,0x2000);
    if ((bVar10) &&
       (bVar10 = basic_substring<const_char>::begins_with
                           ((basic_substring<const_char> *)(local_1a0 + 0x88),']'), bVar10)) {
      bVar10 = has_any(in_RDI,0x200);
      if (bVar10) {
        _append_key_val_null(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
      }
      _stop_seqimap(in_stack_fffffffffffff9d0);
      _pop_level(in_stack_fffffffffffff9c8);
      return true;
    }
    bVar10 = is_debugger_attached();
    if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    basic_substring<char_const>::basic_substring<19ul>
              (local_5a8,(char (*) [19])"ERROR: parse error");
    fmt_01.len = (size_t)in_stack_fffffffffffffe10;
    fmt_01.str = in_stack_fffffffffffffe08;
    _err<>(in_stack_fffffffffffffe00,fmt_01);
    return false;
  }
  bVar10 = has_none(in_RDI,0x100);
  if (!bVar10) {
    local_2b8 = (char *)0x6166206b63656863;
    local_2b0 = 'i';
    uStack_2af = 'l';
    uStack_2ae = 'e';
    uStack_2ad = 'd';
    uStack_2ac = ':';
    uStack_2ab = ' ';
    uStack_2aa = '(';
    uStack_2a9 = 'h';
    local_2a8 = 'a';
    uStack_2a7 = 's';
    uStack_2a6 = '_';
    uStack_2a5 = 'n';
    uStack_2a4 = 'o';
    uStack_2a3 = 'n';
    uStack_2a2 = 'e';
    uStack_2a1 = '(';
    local_2a0 = 0x54584e52;
    local_29c = 0x2929;
    local_29a = 0;
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                       (char *)in_stack_fffffffffffff958,
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
    in_stack_fffffffffffff948 = (flag_t)local_2d0;
    in_stack_fffffffffffff94c = SUB84(local_2d0,4);
    in_stack_fffffffffffff950 = (undefined4)sStack_2c8;
    in_stack_fffffffffffff954 = (undefined4)(sStack_2c8 >> 0x20);
    in_stack_fffffffffffff938 = (flag_t)local_2e0;
    in_stack_fffffffffffff93c = (flag_t)(local_2e0 >> 0x20);
    in_stack_fffffffffffff940 = SUB84(pTStack_2d8,0);
    in_stack_fffffffffffff944 = (undefined4)((ulong)pTStack_2d8 >> 0x20);
    LVar5.super_LineCol.line._0_4_ = in_stack_fffffffffffff940;
    LVar5.super_LineCol.offset = local_2e0;
    LVar5.super_LineCol.line._4_4_ = in_stack_fffffffffffff944;
    LVar5.super_LineCol.col._0_4_ = in_stack_fffffffffffff948;
    LVar5.super_LineCol.col._4_4_ = in_stack_fffffffffffff94c;
    LVar5.name.str._0_4_ = in_stack_fffffffffffff950;
    LVar5.name.str._4_4_ = in_stack_fffffffffffff954;
    LVar5.name.len = (size_t)local_2c0;
    (*p_Var15)((char *)&stack0xfffffffffffffd48,0x1f,LVar5,(in_RDI->m_stack).m_callbacks.m_user_data
              );
    in_stack_fffffffffffff958 = local_2c0;
  }
  bVar10 = has_none(in_RDI,0x80);
  if (!bVar10) {
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffff9d0 = (Parser *)&stack0xfffffffffffffcf8;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                       (char *)in_stack_fffffffffffff958,
                       CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                       CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
    in_stack_fffffffffffff958 = (Parser *)CONCAT17(in_stack_fffffffffffffcf7,local_310);
    in_stack_fffffffffffff948 = (flag_t)local_320;
    in_stack_fffffffffffff94c = (undefined4)((ulong)local_320 >> 0x20);
    in_stack_fffffffffffff950 = (undefined4)uStack_318;
    in_stack_fffffffffffff954 = (undefined4)((ulong)uStack_318 >> 0x20);
    in_stack_fffffffffffff938 = (flag_t)local_330;
    in_stack_fffffffffffff93c = (flag_t)((ulong)local_330 >> 0x20);
    in_stack_fffffffffffff940 = (undefined4)uStack_328;
    in_stack_fffffffffffff944 = (undefined4)((ulong)uStack_328 >> 0x20);
    LVar6.super_LineCol.line._0_4_ = in_stack_fffffffffffff940;
    LVar6.super_LineCol.offset = local_330;
    LVar6.super_LineCol.line._4_4_ = in_stack_fffffffffffff944;
    LVar6.super_LineCol.col._0_4_ = in_stack_fffffffffffff948;
    LVar6.super_LineCol.col._4_4_ = in_stack_fffffffffffff94c;
    LVar6.name.str._0_4_ = in_stack_fffffffffffff950;
    LVar6.name.str._4_4_ = in_stack_fffffffffffff954;
    LVar6.name.len = (size_t)in_stack_fffffffffffff958;
    (*p_Var15)((char *)in_stack_fffffffffffff9d0,0x1f,LVar6,
               (in_RDI->m_stack).m_callbacks.m_user_data);
  }
  bVar10 = has_none(in_RDI,0x200);
  if ((bVar10) &&
     (bVar10 = _scan_scalar_map_flow
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffb0), bVar10)) {
    local_348 = (char *)local_1a0._136_8_;
    local_340 = local_110;
    s.len = (size_t)in_stack_fffffffffffff9a0;
    s.str = (char *)in_stack_fffffffffffff998;
    _store_scalar((Parser *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),s,
                  in_stack_fffffffffffff98c);
    local_1a0._136_8_ = (in_RDI->m_state->line_contents).rem.str;
    local_110 = (char *)(in_RDI->m_state->line_contents).rem.len;
    basic_substring<char_const>::basic_substring<3ul>
              ((basic_substring<char_const> *)&stack0xfffffffffffffc98,(char (*) [3])" \t");
    chars_00.len = in_stack_fffffffffffff9a8;
    chars_00.str = in_stack_fffffffffffff9a0;
    local_358 = basic_substring<const_char>::triml(in_stack_fffffffffffff998,chars_00);
    if (local_358.len != 0) {
      basic_substring<char_const>::basic_substring<3ul>(local_378,(char (*) [3])0x3e7cad);
      pattern_00.str._7_1_ = in_stack_fffffffffffff967;
      pattern_00.str._0_7_ = in_stack_fffffffffffff960;
      pattern_00.len = (size_t)in_stack_fffffffffffff968;
      bVar10 = basic_substring<const_char>::begins_with
                         ((basic_substring<const_char> *)in_stack_fffffffffffff958,pattern_00);
      if (!bVar10) {
        basic_substring<char_const>::basic_substring<4ul>
                  ((basic_substring<char_const> *)&local_388,(char (*) [4])":,}");
        bVar10 = basic_substring<const_char>::begins_with_any(&local_358,local_388);
        if (!bVar10) goto LAB_0039e14a;
      }
      if (local_358.str < (ulong)local_1a0._136_8_) {
        memcpy(local_3b8,"check failed: (trimmed.str >= rem.str)",0x27);
        eVar11 = get_error_flags();
        if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        in_stack_fffffffffffff9c8 = (Parser *)(in_RDI->m_stack).m_callbacks.m_error;
        Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960)
                           ,(char *)in_stack_fffffffffffff958,
                           CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                           CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                           CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
        (*(code *)in_stack_fffffffffffff9c8)
                  (local_3b8,0x27,(in_RDI->m_stack).m_callbacks.m_user_data);
        in_stack_fffffffffffff938 = local_3e0;
        in_stack_fffffffffffff93c = fStack_3dc;
        in_stack_fffffffffffff940 = uStack_3d8;
        in_stack_fffffffffffff944 = uStack_3d4;
        in_stack_fffffffffffff948 = local_3d0;
        in_stack_fffffffffffff94c = uStack_3cc;
        in_stack_fffffffffffff950 = uStack_3c8;
        in_stack_fffffffffffff954 = uStack_3c4;
        in_stack_fffffffffffff958 = local_3c0;
      }
      local_3e8 = local_358.str + -local_1a0._136_8_;
      in_stack_fffffffffffff9b8 = (basic_substring<const_char> *)(local_1a0 + 0x88);
      local_b8 = local_3e8;
      local_b0 = in_stack_fffffffffffff9b8;
      if (local_110 < local_3e8) {
        eVar11 = get_error_flags();
        if (((eVar11 & 1) != 0) &&
           (in_stack_fffffffffffff9b7 = is_debugger_attached(), (bool)in_stack_fffffffffffff9b7)) {
          trap_instruction();
        }
        local_c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_c0 = 0x1533;
        handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                 (char *)in_stack_fffffffffffff958,
                 CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
      local_3f8 = local_a8;
      local_3f0 = local_a0;
      local_1a0._136_8_ = local_a8;
      local_110 = local_a0;
      _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
    }
  }
LAB_0039e14a:
  basic_substring<char_const>::basic_substring<3ul>(local_408,(char (*) [3])0x3e7cad);
  pattern_01.str._7_1_ = in_stack_fffffffffffff967;
  pattern_01.str._0_7_ = in_stack_fffffffffffff960;
  pattern_01.len = (size_t)in_stack_fffffffffffff968;
  bVar10 = basic_substring<const_char>::begins_with
                     ((basic_substring<const_char> *)in_stack_fffffffffffff958,pattern_01);
  if (bVar10) {
    addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
    _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
    bVar10 = has_all(in_RDI,0x200);
    if (!bVar10) {
      _store_scalar_null(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    }
    return true;
  }
  local_90 = local_1a0 + 0x88;
  local_91 = 0x3a;
  iVar12 = basic_substring<const_char>::compare
                     ((basic_substring<const_char> *)in_stack_fffffffffffff958,
                      (char)((uint)in_stack_fffffffffffff954 >> 0x18));
  if (iVar12 == 0) {
    addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
    _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
    bVar10 = has_all(in_RDI,0x200);
    if (!bVar10) {
      _store_scalar_null(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    }
    return true;
  }
  bVar10 = basic_substring<const_char>::begins_with
                     ((basic_substring<const_char> *)(local_1a0 + 0x88),'?');
  if (bVar10) {
    add_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
              in_stack_fffffffffffff93c);
    _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
    return true;
  }
  bVar10 = basic_substring<const_char>::begins_with
                     ((basic_substring<const_char> *)(local_1a0 + 0x88),',');
  if (bVar10) {
    _append_key_val_null(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
    return true;
  }
  bVar10 = basic_substring<const_char>::begins_with
                     ((basic_substring<const_char> *)(local_1a0 + 0x88),'}');
  if (bVar10) {
    bVar10 = has_all(in_RDI,0x200);
    if (!bVar10) {
      builtin_strncpy(local_428,"check failed: (has_all(SSCL))",0x1e);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var15 = (in_RDI->m_stack).m_callbacks.m_error;
      pcVar16 = local_428;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                         (char *)in_stack_fffffffffffff958,
                         CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                         CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
      in_stack_fffffffffffff93c = (flag_t)((ulong)local_450 >> 0x20);
      in_stack_fffffffffffff940 = (undefined4)uStack_448;
      in_stack_fffffffffffff944 = (undefined4)((ulong)uStack_448 >> 0x20);
      LVar7.super_LineCol.line._0_4_ = in_stack_fffffffffffff940;
      LVar7.super_LineCol.offset = local_450;
      LVar7.super_LineCol.line._4_4_ = in_stack_fffffffffffff944;
      LVar7.super_LineCol.col._0_4_ = (int)local_440;
      LVar7.super_LineCol.col._4_4_ = (int)((ulong)local_440 >> 0x20);
      LVar7.name.str._0_4_ = (int)uStack_438;
      LVar7.name.str._4_4_ = (int)((ulong)uStack_438 >> 0x20);
      LVar7.name.len = local_430;
      (*p_Var15)(pcVar16,0x1e,LVar7,(in_RDI->m_stack).m_callbacks.m_user_data);
    }
    _append_key_val_null(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    rem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
              in_stack_fffffffffffff93c);
    bVar10 = has_all(in_RDI,0x2000);
    if (bVar10) {
      _stop_seqimap(in_stack_fffffffffffff9d0);
      _pop_level(in_stack_fffffffffffff9c8);
    }
    _pop_level(in_stack_fffffffffffff9c8);
    _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
    return true;
  }
  bVar10 = _handle_types(in_stack_ffffffffffffffd8);
  if (bVar10) {
    return true;
  }
  bVar10 = _handle_key_anchors_and_refs(in_stack_fffffffffffffaa8);
  if (bVar10) {
    return true;
  }
  iVar12 = basic_substring<const_char>::compare
                     (in_stack_fffffffffffff9b8,
                      (char *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                      in_stack_fffffffffffff9a8);
  if (iVar12 != 0) {
    basic_substring<char_const>::basic_substring<3ul>(local_468,(char (*) [3])" \t");
    chars.len._0_4_ = in_stack_fffffffffffff988;
    chars.str = (char *)in_stack_fffffffffffff980;
    chars.len._4_4_ = in_stack_fffffffffffff98c;
    local_458 = (char *)basic_substring<const_char>::first_not_of
                                  (in_stack_fffffffffffff978,chars,in_stack_fffffffffffff970);
    if (local_458 == (char *)0xffffffffffffffff) {
      local_458 = (char *)0x0;
    }
    local_e0 = local_1a0 + 0x88;
    local_e8 = local_458;
    if (local_110 < local_458) {
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      local_f8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_f0 = 0x1533;
      handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)
               CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
               (char *)in_stack_fffffffffffff958,
               CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    local_478 = local_d8;
    local_470 = local_d0;
    local_1a0._136_8_ = local_d8;
    local_110 = (char *)local_d0;
    bVar10 = basic_substring<const_char>::begins_with
                       ((basic_substring<const_char> *)(local_1a0 + 0x88),':');
    if (!bVar10) {
      bVar10 = basic_substring<const_char>::begins_with
                         ((basic_substring<const_char> *)(local_1a0 + 0x88),'#');
      if (!bVar10) {
        bVar10 = is_debugger_attached();
        if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
          trap_instruction();
        }
        basic_substring<char_const>::basic_substring<19ul>
                  (local_498,(char (*) [19])"ERROR: parse error");
        fmt_00.len = (size_t)in_stack_fffffffffffffe10;
        fmt_00.str = in_stack_fffffffffffffe08;
        _err<>(in_stack_fffffffffffffe00,fmt_00);
        return false;
      }
      _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
      _scan_comment(in_stack_fffffffffffffa08);
      return true;
    }
    addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 in_stack_fffffffffffff93c,in_stack_fffffffffffff938);
    _line_progressed(in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
    bVar10 = has_all(in_RDI,0x200);
    if (!bVar10) {
      _store_scalar_null(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    }
    return true;
  }
  return true;
}

Assistant:

bool Parser::_handle_map_flow()
{
    // explicit flow, ie, inside {}, separated by commas
    _c4dbgpf("handle_map_flow: node_id={}  level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RMAP|FLOW));

    if(rem.begins_with(' '))
    {
        // with explicit flow, indentation does not matter
        _c4dbgp("starts with spaces");
        _skipchars(' ');
        return true;
    }
    _RYML_WITH_TAB_TOKENS(else if(rem.begins_with('\t'))
    {
        // with explicit flow, indentation does not matter
        _c4dbgp("starts with tabs");
        _skipchars('\t');
        return true;
    })
    else if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment(); // also progresses the line
        return true;
    }
    else if(rem.begins_with('}'))
    {
        _c4dbgp("end the map");
        if(has_all(SSCL))
        {
            _c4dbgp("the last val was null");
            _append_key_val_null(rem.str - 1);
            rem_flags(RVAL);
        }
        _pop_level();
        _line_progressed(1);
        if(has_all(RSEQIMAP))
        {
            _c4dbgp("stopping implicitly nested 1x map");
            _stop_seqimap();
            _pop_level();
        }
        return true;
    }

    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RSEQIMAP));

        if(rem.begins_with(", "))
        {
            _c4dbgp("seq: expect next keyval");
            addrem_flags(RKEY, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("seq: expect next keyval");
            addrem_flags(RKEY, RNXT);
            _line_progressed(1);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RKEY))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        bool is_quoted;
        if(has_none(SSCL) && _scan_scalar_map_flow(&rem, &is_quoted))
        {
            _c4dbgp("it's a scalar");
            _store_scalar(rem, is_quoted);
            rem = m_state->line_contents.rem;
            csubstr trimmed = rem.triml(" \t");
            if(trimmed.len && (trimmed.begins_with(": ") || trimmed.begins_with_any(":,}") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t"))))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks, trimmed.str >= rem.str);
                size_t num = static_cast<size_t>(trimmed.str - rem.str);
                _c4dbgpf("trimming {} whitespace after the scalar: '{}' --> '{}'", num, rem, rem.sub(num));
                rem = rem.sub(num);
                _line_progressed(num);
            }
        }

        if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgp("wait for val");
            addrem_flags(RVAL, RKEY|QMRK);
            _line_progressed(2);
            if(!has_all(SSCL))
            {
                _c4dbgp("no key was found, defaulting to empty key ''");
                _store_scalar_null(rem.str);
            }
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgp("wait for val");
            addrem_flags(RVAL, RKEY|QMRK);
            _line_progressed(1);
            if(!has_all(SSCL))
            {
                _c4dbgp("no key was found, defaulting to empty key ''");
                _store_scalar_null(rem.str);
            }
            return true;
        }
        else if(rem.begins_with('?'))
        {
            _c4dbgp("complex key");
            add_flags(QMRK);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("prev scalar was a key with null value");
            _append_key_val_null(rem.str - 1);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('}'))
        {
            _c4dbgp("map terminates after a key...");
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(SSCL));
            _c4dbgp("the last val was null");
            _append_key_val_null(rem.str - 1);
            rem_flags(RVAL);
            if(has_all(RSEQIMAP))
            {
                _c4dbgp("stopping implicitly nested 1x map");
                _stop_seqimap();
                _pop_level();
            }
            _pop_level();
            _line_progressed(1);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else if(rem == "")
        {
            return true;
        }
        else
        {
            size_t pos = rem.first_not_of(" \t");
            if(pos == csubstr::npos)
               pos = 0;
            rem = rem.sub(pos);
            if(rem.begins_with(':'))
            {
                _c4dbgp("wait for val");
                addrem_flags(RVAL, RKEY|QMRK);
                _line_progressed(pos + 1);
                if(!has_all(SSCL))
                {
                    _c4dbgp("no key was found, defaulting to empty key ''");
                    _store_scalar_null(rem.str);
                }
                return true;
            }
            else if(rem.begins_with('#'))
            {
                _c4dbgp("it's a comment");
                _line_progressed(pos);
                rem = _scan_comment(); // also progresses the line
                return true;
            }
            else
            {
                _c4err("parse error");
            }
        }
    }
    else if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(SSCL));
        bool is_quoted;
        if(_scan_scalar_map_flow(&rem, &is_quoted))
        {
            _c4dbgp("it's a scalar");
            addrem_flags(RNXT, RVAL|RKEY);
            _append_key_val(rem, is_quoted);
            if(has_all(RSEQIMAP))
            {
                _c4dbgp("stopping implicitly nested 1x map");
                _stop_seqimap();
                _pop_level();
            }
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq");
            addrem_flags(RNXT, RVAL|RKEY); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map");
            addrem_flags(RNXT, RVAL|RKEY); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_map();
            addrem_flags(FLOW|RKEY, RNXT|RVAL);
            _line_progressed(1);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("appending empty val");
            _append_key_val_null(rem.str - 1);
            addrem_flags(RKEY, RVAL);
            _line_progressed(1);
            if(has_any(RSEQIMAP))
            {
                _c4dbgp("stopping implicitly nested 1x map");
                _stop_seqimap();
                _pop_level();
            }
            return true;
        }
        else if(has_any(RSEQIMAP) && rem.begins_with(']'))
        {
            _c4dbgp("stopping implicitly nested 1x map");
            if(has_any(SSCL))
            {
                _append_key_val_null(rem.str - 1);
            }
            _stop_seqimap();
            _pop_level();
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return false;
}